

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::
unordered_flat_map<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
::~unordered_flat_map
          (unordered_flat_map<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
           *this)

{
  detail::foa::
  table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
  ::~table((table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
            *)0x54a07e);
  return;
}

Assistant:

~unordered_flat_map() = default;